

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_futime(uv_fs_t *req)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  undefined1 local_38 [8];
  timespec ts [2];
  uv_fs_t *req_local;
  
  local_38 = (undefined1  [8])(long)req->atime;
  dVar3 = req->atime * 1000000.0;
  uVar2 = (ulong)dVar3;
  ts[0].tv_sec = ((uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f) % 1000000) *
                 1000;
  ts[0].tv_nsec = (__syscall_slong_t)req->mtime;
  dVar3 = req->mtime * 1000000.0;
  uVar2 = (ulong)dVar3;
  ts[1].tv_sec = ((uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f) % 1000000) *
                 1000;
  iVar1 = futimens(req->file,(timespec *)local_38);
  return (long)iVar1;
}

Assistant:

static ssize_t uv__fs_futime(uv_fs_t* req) {
#if defined(__linux__)                                                        \
    || defined(_AIX71)
  /* utimesat() has nanosecond resolution but we stick to microseconds
   * for the sake of consistency with other platforms.
   */
  struct timespec ts[2];
  ts[0].tv_sec  = req->atime;
  ts[0].tv_nsec = (uint64_t)(req->atime * 1000000) % 1000000 * 1000;
  ts[1].tv_sec  = req->mtime;
  ts[1].tv_nsec = (uint64_t)(req->mtime * 1000000) % 1000000 * 1000;
  return futimens(req->file, ts);
#elif defined(__APPLE__)                                                      \
    || defined(__DragonFly__)                                                 \
    || defined(__FreeBSD__)                                                   \
    || defined(__FreeBSD_kernel__)                                            \
    || defined(__NetBSD__)                                                    \
    || defined(__OpenBSD__)                                                   \
    || defined(__sun)
  struct timeval tv[2];
  tv[0].tv_sec  = req->atime;
  tv[0].tv_usec = (uint64_t)(req->atime * 1000000) % 1000000;
  tv[1].tv_sec  = req->mtime;
  tv[1].tv_usec = (uint64_t)(req->mtime * 1000000) % 1000000;
# if defined(__sun)
  return futimesat(req->file, NULL, tv);
# else
  return futimes(req->file, tv);
# endif
#elif defined(__MVS__)
  attrib_t atr;
  memset(&atr, 0, sizeof(atr));
  atr.att_mtimechg = 1;
  atr.att_atimechg = 1;
  atr.att_mtime = req->mtime;
  atr.att_atime = req->atime;
  return __fchattr(req->file, &atr, sizeof(atr));
#else
  errno = ENOSYS;
  return -1;
#endif
}